

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::type_to_array_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type)

{
  uint uVar1;
  CompilerError *this_00;
  uint32_t uVar2;
  CompilerGLSL *this_01;
  size_t sVar3;
  bool bVar4;
  string local_70;
  string local_50;
  
  if ((((type->pointer == true) && (type->storage == StorageClassPhysicalStorageBuffer)) &&
      (*(int *)&(type->super_IVariant).field_0xc != 0xf)) ||
     (sVar3 = (type->array).super_VectorView<unsigned_int>.buffer_size, sVar3 == 0)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_70);
  }
  else if ((this->options).flatten_multidimensional_arrays == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (int)(type->array).super_VectorView<unsigned_int>.buffer_size - 1;
    while (uVar2 != 0xffffffff) {
      this_01 = this;
      to_array_size_abi_cxx11_(&local_50,this,type,uVar2);
      enclose_expression(&local_70,this_01,&local_50);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_50);
      bVar4 = uVar2 != 0;
      uVar2 = uVar2 - 1;
      if (bVar4) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    if (sVar3 == 1) {
      sVar3 = 1;
    }
    else {
      bVar4 = (this->options).es;
      uVar1 = (this->options).version;
      if (uVar1 < 0x1ae && bVar4 == false) {
        ::std::__cxx11::string::string
                  ((string *)&local_70,"GL_ARB_arrays_of_arrays",(allocator *)&local_50);
        require_extension_internal(this,&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        sVar3 = (type->array).super_VectorView<unsigned_int>.buffer_size;
      }
      else if ((bVar4 & uVar1 < 0x136) == 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_70,
                   "Arrays of arrays not supported before ESSL version 310. Try using --flatten-multidimensional-arrays or set options.flatten_multidimensional_arrays to true."
                   ,(allocator *)&local_50);
        CompilerError::CompilerError(this_00,&local_70);
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar2 = (uint32_t)sVar3;
    while (uVar2 = uVar2 - 1, uVar2 != 0xffffffff) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_array_size_abi_cxx11_(&local_70,this,type,uVar2);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_array_glsl(const SPIRType &type)
{
	if (type.pointer && type.storage == StorageClassPhysicalStorageBufferEXT && type.basetype != SPIRType::Struct)
	{
		// We are using a wrapped pointer type, and we should not emit any array declarations here.
		return "";
	}

	if (type.array.empty())
		return "";

	if (options.flatten_multidimensional_arrays)
	{
		string res;
		res += "[";
		for (auto i = uint32_t(type.array.size()); i; i--)
		{
			res += enclose_expression(to_array_size(type, i - 1));
			if (i > 1)
				res += " * ";
		}
		res += "]";
		return res;
	}
	else
	{
		if (type.array.size() > 1)
		{
			if (!options.es && options.version < 430)
				require_extension_internal("GL_ARB_arrays_of_arrays");
			else if (options.es && options.version < 310)
				SPIRV_CROSS_THROW("Arrays of arrays not supported before ESSL version 310. "
				                  "Try using --flatten-multidimensional-arrays or set "
				                  "options.flatten_multidimensional_arrays to true.");
		}

		string res;
		for (auto i = uint32_t(type.array.size()); i; i--)
		{
			res += "[";
			res += to_array_size(type, i - 1);
			res += "]";
		}
		return res;
	}
}